

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.h
# Opt level: O3

void __thiscall Coin::Serialize<DataStream>(Coin *this,DataStream *s)

{
  long in_FS_OFFSET;
  Wrapper<ScriptCompression,_const_CScript_&> local_28;
  Wrapper<AmountCompression,_const_long_&> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->out).nValue == -1) {
    __assert_fail("!IsSpent()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/coins.h"
                  ,0x3f,"void Coin::Serialize(Stream &) const [Stream = DataStream]");
  }
  WriteVarInt<DataStream,(VarIntMode)0,unsigned_int>(s,*(uint *)&this->field_0x28);
  local_28.m_object = &(this->out).scriptPubKey;
  local_20.m_object = (long *)this;
  SerializeMany<DataStream,Wrapper<AmountCompression,long_const&>,Wrapper<ScriptCompression,CScript_const&>>
            (s,&local_20,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream &s) const {
        assert(!IsSpent());
        uint32_t code = nHeight * uint32_t{2} + fCoinBase;
        ::Serialize(s, VARINT(code));
        ::Serialize(s, Using<TxOutCompression>(out));
    }